

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

int Cnf_DataWriteOrClause2(void *p,Cnf_Dat_t *pCnf)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *piVar4;
  int iVar5;
  lit *begin;
  long lVar6;
  
  pAVar1 = pCnf->pMan;
  begin = (lit *)malloc((long)pAVar1->nObjs[3] << 2);
  pVVar2 = pAVar1->vCos;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    piVar4 = pCnf->pVarNums;
    lVar6 = 0;
    do {
      begin[lVar6] = piVar4[*(int *)((long)ppvVar3[lVar6] + 0x24)] * 2;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar2->nSize);
  }
  iVar5 = sat_solver2_addclause((sat_solver2 *)p,begin,begin + pAVar1->nObjs[3],0);
  if (begin != (lit *)0x0) {
    free(begin);
  }
  return (int)(iVar5 != 0);
}

Assistant:

int Cnf_DataWriteOrClause2( void * p, Cnf_Dat_t * pCnf )
{
    sat_solver2 * pSat = (sat_solver2 *)p;
    Aig_Obj_t * pObj;
    int i, * pLits;
    pLits = ABC_ALLOC( int, Aig_ManCoNum(pCnf->pMan) );
    Aig_ManForEachCo( pCnf->pMan, pObj, i )
        pLits[i] = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
    if ( !sat_solver2_addclause( pSat, pLits, pLits + Aig_ManCoNum(pCnf->pMan), 0 ) )
    {
        ABC_FREE( pLits );
        return 0;
    }
    ABC_FREE( pLits );
    return 1;
}